

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::PageAllocatorBase(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    *this,AllocationPolicyManager *policyManager,ConfigFlagsTable *flagTable,
                   PageAllocatorType type,uint maxFreePageCount,bool zeroPages,
                   BackgroundPageQueue *backgroundPageQueue,uint maxAllocPageCount,
                   uint secondaryAllocPageCount,bool stopAllocationOnOutOfMemory,
                   bool excludeGuardPages,HANDLE processHandle,bool enableWriteBarrier)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PageMemoryData *pPVar4;
  
  (this->super_PageAllocatorBaseCommon).virtualAllocator = (void *)0x0;
  (this->super_PageAllocatorBaseCommon).allocatorType = VirtualAlloc;
  this->_vptr_PageAllocatorBase = (_func_int **)&PTR_SetDisableThreadAccessCheck_014d96a8;
  (this->segments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.base =
       &(this->segments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->segments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.prev.base =
       &(this->segments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->segments).super_RealCount.count = 0;
  (this->fullSegments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.base =
       &(this->fullSegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->fullSegments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.prev.base =
       &(this->fullSegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->fullSegments).super_RealCount.count = 0;
  (this->emptySegments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.base =
       &(this->emptySegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->emptySegments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.prev.base =
       &(this->emptySegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->emptySegments).super_RealCount.count = 0;
  (this->decommitSegments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.base =
       &(this->decommitSegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->decommitSegments).
  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.prev.base =
       &(this->decommitSegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->decommitSegments).super_RealCount.count = 0;
  (this->largeSegments).
  super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.base =
       &(this->largeSegments).
        super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->largeSegments).
  super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.prev.base =
       &(this->largeSegments).
        super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>;
  (this->largeSegments).super_RealCount.count = 0;
  this->allocFlags = 0;
  this->maxFreePageCount = maxFreePageCount;
  this->freePageCount = 0;
  this->secondaryAllocPageCount = secondaryAllocPageCount;
  this->isClosed = false;
  this->stopAllocationOnOutOfMemory = stopAllocationOnOutOfMemory;
  this->disableAllocationOutOfMemory = false;
  this->excludeGuardPages = excludeGuardPages;
  this->enableWriteBarrier = enableWriteBarrier;
  this->policyManager = policyManager;
  this->pageAllocatorFlagTable = flagTable;
  this->zeroPages = zeroPages;
  this->backgroundPageQueue = backgroundPageQueue;
  this->queueZeroPages = false;
  this->hasZeroQueuedPages = false;
  this->isUsed = false;
  this->waitingToEnterIdleDecommit = false;
  this->idleDecommitBackOffCount = 0;
  this->minFreePageCount = 0;
  this->idleDecommitEnterCount = 1;
  this->processHandle = processHandle;
  this->usedBytes = 0;
  this->type = type;
  this->numberOfSegments = 0;
  this->reservedBytes = 0;
  this->committedBytes = 0;
  if (((int)(secondaryAllocPageCount + maxAllocPageCount) < 1) ||
     ((secondaryAllocPageCount + maxAllocPageCount + 0x7fffffff &
      secondaryAllocPageCount + maxAllocPageCount) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x2cb,"(Math::IsPow2(maxAllocPageCount + secondaryAllocPageCount))",
                       "Illegal maxAllocPageCount: Why is this not a power of 2 aligned?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->maxAllocPageCount = maxAllocPageCount;
  this->concurrentThreadId = 0xffffffff;
  this->disableThreadAccessCheck = false;
  this->debugMinFreePageCount = 0;
  this->threadContextHandle = (ThreadContextId)0x0;
  this->decommitPageCount = 0;
  this->debugName = (char16 *)0x0;
  this->verifyEnabled = false;
  this->disablePageReuse = false;
  pPVar4 = MemoryProfiler::GetPageMemoryData(type);
  this->memoryData = pPVar4;
  PageTracking::PageAllocatorCreated((PageAllocator *)this);
  return;
}

Assistant:

PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::PageAllocatorBase(AllocationPolicyManager * policyManager,
    Js::ConfigFlagsTable& flagTable,
    PageAllocatorType type,
    uint maxFreePageCount, bool zeroPages,
#if ENABLE_BACKGROUND_PAGE_FREEING
    BackgroundPageQueue * backgroundPageQueue,
#endif
    uint maxAllocPageCount, 
    uint secondaryAllocPageCount,
    bool stopAllocationOnOutOfMemory, 
    bool excludeGuardPages, 
    HANDLE processHandle, 
    bool enableWriteBarrier
) :
    policyManager(policyManager),
    pageAllocatorFlagTable(flagTable),
    maxFreePageCount(maxFreePageCount),
    freePageCount(0),
    allocFlags(0),
    zeroPages(zeroPages),
#if ENABLE_BACKGROUND_PAGE_ZEROING
    queueZeroPages(false),
    hasZeroQueuedPages(false),
    backgroundPageQueue(backgroundPageQueue),
#endif
    minFreePageCount(0),
    isUsed(false),
    waitingToEnterIdleDecommit(false),
#if DBG
    idleDecommitBackOffCount(0),
#endif
    idleDecommitEnterCount(1),
    isClosed(false),
    stopAllocationOnOutOfMemory(stopAllocationOnOutOfMemory),
    disableAllocationOutOfMemory(false),
    secondaryAllocPageCount(secondaryAllocPageCount),
    excludeGuardPages(excludeGuardPages),
    type(type)
    , reservedBytes(0)
    , committedBytes(0)
    , usedBytes(0)
    , numberOfSegments(0)
    , processHandle(processHandle)
    , enableWriteBarrier(enableWriteBarrier)
#ifdef ENABLE_BASIC_TELEMETRY
    ,decommitStats(nullptr)
#endif
{
    AssertMsg(Math::IsPow2(maxAllocPageCount + secondaryAllocPageCount), "Illegal maxAllocPageCount: Why is this not a power of 2 aligned?");

    this->maxAllocPageCount = maxAllocPageCount;

#if DBG
    // By default, a page allocator is not associated with any thread context
    // Any host which wishes to associate it with a thread context must do so explicitly
    this->threadContextHandle = NULL;
    this->concurrentThreadId = (DWORD)-1;
#endif
#if DBG
    this->disableThreadAccessCheck = false;
    this->debugMinFreePageCount = 0;
#endif
#if DBG_DUMP
    this->decommitPageCount = 0;
    this->debugName = nullptr;
#endif
#ifdef RECYCLER_MEMORY_VERIFY
    this->verifyEnabled = false;
    this->disablePageReuse = false;
#endif

#ifdef PROFILE_MEM
    this->memoryData = MemoryProfiler::GetPageMemoryData(type);
#endif

    PageTracking::PageAllocatorCreated((PageAllocator*)this);
}